

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

FFile * __thiscall FCompressedFile::Read(FCompressedFile *this,void *mem,uint len)

{
  if (this->m_Mode == EReading) {
    if (this->m_BufferSize < this->m_Pos + len) {
      I_Error("Attempt to read past end of cfile");
    }
    if (len == 1) {
      *(uchar *)mem = this->m_Buffer[this->m_Pos];
    }
    else {
      memcpy(mem,this->m_Buffer + this->m_Pos,(ulong)len);
    }
    this->m_Pos = this->m_Pos + len;
  }
  else {
    I_Error("Tried to read from writing cfile");
  }
  return &this->super_FFile;
}

Assistant:

FFile &FCompressedFile::Read (void *mem, unsigned int len)
{
	if (m_Mode == EReading)
	{
		if (m_Pos + len > m_BufferSize)
		{
			I_Error ("Attempt to read past end of cfile");
		}
		if (len == 1)
			*(BYTE *)mem = m_Buffer[m_Pos];
		else
			memcpy (mem, m_Buffer + m_Pos, len);
		m_Pos += len;
	}
	else
	{
		I_Error ("Tried to read from writing cfile");
	}
	return *this;
}